

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall CLI::Option::type_name(Option *this,string *typeval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_class_32_1_50816887 local_58;
  _Any_data local_38;
  code *local_28;
  
  paVar1 = &local_58.typeval.field_2;
  pcVar2 = (typeval->_M_dataplus)._M_p;
  local_58.typeval._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + typeval->_M_string_length);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Option::type_name(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)local_38._M_pod_data,&local_58);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&this->type_name_,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.typeval._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.typeval._M_dataplus._M_p,
                    local_58.typeval.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Option *type_name(std::string typeval) {
        type_name_fn([typeval]() { return typeval; });
        return this;
    }